

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_server.h
# Opt level: O3

void __thiscall
rest_rpc::rpc_service::rpc_server::publish<std::__cxx11::string>
          (rpc_server *this,string *key,string *token,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  size_type sVar3;
  connection *this_00;
  _Atomic_word _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
  _Var6;
  long *plVar7;
  size_type *psVar8;
  bool bVar9;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>_>
  pVar10;
  unique_lock<std::mutex> lock_1;
  unique_lock<std::mutex> lock;
  undefined1 local_e0 [32];
  string *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  string *local_b0;
  _func_int ***local_a8;
  size_type local_a0;
  _func_int **local_98;
  undefined8 uStack_90;
  string *local_88;
  unique_lock<std::mutex> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  error_code local_40;
  
  local_e0._8_8_ = local_e0._8_8_ & 0xffffffffffffff00;
  local_e0._0_8_ = &this->sub_mtx_;
  local_c0 = key;
  local_b0 = token;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_e0);
  local_e0[8] = 1;
  sVar3 = (this->sub_map_)._M_h._M_element_count;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_e0);
  if (sVar3 != 0) {
    local_a8 = (_func_int ***)(data->_M_dataplus)._M_p;
    paVar1 = &data->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8 == paVar1) {
      local_98 = (_func_int **)paVar1->_M_allocated_capacity;
      uStack_90 = *(undefined8 *)((long)&data->field_2 + 8);
      local_a8 = &local_98;
    }
    else {
      local_98 = (_func_int **)paVar1->_M_allocated_capacity;
    }
    local_a0 = data->_M_string_length;
    (data->_M_dataplus)._M_p = (pointer)paVar1;
    data->_M_string_length = 0;
    (data->field_2)._M_local_buf[0] = '\0';
    local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
    local_b8->_M_use_count = 1;
    local_b8->_M_weak_count = 1;
    local_b8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b4358;
    local_88 = (string *)(local_b8 + 1);
    p_Var5 = local_b8 + 2;
    local_b8[1]._vptr__Sp_counted_base = (_func_int **)p_Var5;
    if (local_a8 == &local_98) {
      p_Var5->_vptr__Sp_counted_base = local_98;
      local_b8[2]._M_use_count = (undefined4)uStack_90;
      local_b8[2]._M_weak_count = uStack_90._4_4_;
    }
    else {
      (local_88->_M_dataplus)._M_p = (pointer)local_a8;
      p_Var5->_vptr__Sp_counted_base = local_98;
    }
    local_b8[1]._M_use_count = (undefined4)local_a0;
    local_b8[1]._M_weak_count = local_a0._4_4_;
    local_a0 = 0;
    local_98 = (_func_int **)((ulong)local_98 & 0xffffffffffffff00);
    local_80._M_owns = false;
    local_a8 = &local_98;
    local_80._M_device = &this->sub_mtx_;
    std::unique_lock<std::mutex>::lock(&local_80);
    local_80._M_owns = true;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   local_c0,local_b0);
    pVar10 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
             ::equal_range(&(this->sub_map_)._M_h,(key_type *)local_e0);
    _Var6._M_cur = (__node_type *)
                   pVar10.first.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                   ._M_cur;
    if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
      operator_delete((void *)local_e0._0_8_);
    }
    if ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
         )_Var6._M_cur ==
        pVar10.second.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
        ._M_cur.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
       ) {
      if (asio::system_category()::instance == '\0') {
        publish<std::__cxx11::string>();
      }
      std::operator+(&local_70,"The subscriber of the key: ",local_c0);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((mutex *)*plVar7 == (mutex *)psVar8) {
        local_e0._16_8_ = *psVar8;
        local_e0._24_8_ = plVar7[3];
        local_e0._0_8_ = (mutex *)(local_e0 + 0x10);
      }
      else {
        local_e0._16_8_ = *psVar8;
        local_e0._0_8_ = (mutex *)*plVar7;
      }
      local_e0._8_8_ = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((this->err_cb_).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_40._M_value = 0x16;
        local_40._M_cat = (error_category *)&asio::system_category()::instance;
        local_50.data_ = (const_pointer)local_e0._0_8_;
        local_50.size_ = local_e0._8_8_;
        (*(this->err_cb_)._M_invoker)((_Any_data *)&this->err_cb_,&local_40,&local_50);
      }
      if ((mutex *)local_e0._0_8_ != (mutex *)(local_e0 + 0x10)) {
        operator_delete((void *)local_e0._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    else {
      do {
        p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&((_Var6._M_cur)->
                          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                          ).
                          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>
                          ._M_storage._M_storage + 0x28);
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          _Var4 = p_Var5->_M_use_count;
          do {
            if (_Var4 == 0) goto LAB_0017b705;
            LOCK();
            iVar2 = p_Var5->_M_use_count;
            bVar9 = _Var4 == iVar2;
            if (bVar9) {
              p_Var5->_M_use_count = _Var4 + 1;
              iVar2 = _Var4;
            }
            _Var4 = iVar2;
            UNLOCK();
          } while (!bVar9);
          if (((p_Var5->_M_use_count != 0) &&
              (this_00 = *(connection **)
                          ((long)&((_Var6._M_cur)->
                                  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>
                                  ._M_storage._M_storage + 0x20), this_00 != (connection *)0x0)) &&
             (this_00->has_closed_ == false)) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0,local_c0,local_b0);
            connection::publish(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_e0,local_88);
            if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
              operator_delete((void *)local_e0._0_8_);
            }
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
LAB_0017b705:
        _Var6._M_cur = (__node_type *)((_Var6._M_cur)->super__Hash_node_base)._M_nxt;
      } while ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                )_Var6._M_cur !=
               pVar10.second.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
               ._M_cur.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
              );
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_80);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  return;
}

Assistant:

void publish(std::string key, std::string token, T data) {
    {
      std::unique_lock<std::mutex> lock(sub_mtx_);
      if (sub_map_.empty())
        return;
    }

    std::shared_ptr<std::string> shared_data =
        get_shared_data<T>(std::move(data));
    std::unique_lock<std::mutex> lock(sub_mtx_);
    auto range = sub_map_.equal_range(key + token);
    if (range.first != range.second) {
      for (auto it = range.first; it != range.second; ++it) {
        auto conn = it->second.lock();
        if (conn == nullptr || conn->has_closed()) {
          continue;
        }

        conn->publish(key + token, *shared_data);
      }
    } else {
      error_callback(
          asio::error::make_error_code(asio::error::invalid_argument),
          "The subscriber of the key: " + key + " does not exist.");
    }
  }